

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTiledRgba.cpp
# Opt level: O0

void anon_unknown.dwarf_24c551::writeReadRGBARIP
               (char *fileName,int width,int height,RgbaChannels channels,Compression comp,int xSize
               ,int ySize)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  RgbaChannels RVar6;
  ostream *poVar7;
  void *pvVar8;
  undefined4 *puVar9;
  int *piVar10;
  Array2D<Imf_3_4::Rgba> *pAVar11;
  Rgba *pRVar12;
  float *pfVar13;
  Vec2<float> *v;
  RgbaChannels in_ECX;
  int in_EDX;
  int in_ESI;
  char *in_RDI;
  int in_R8D;
  int in_R9D;
  float fVar14;
  float fVar15;
  int in_stack_00000008;
  int x;
  int y;
  int lx;
  int ly;
  int levelHeight_1;
  int levelWidth_1;
  int xlevel_1;
  int ylevel_1;
  Array2D<Imf_3_4::Array2D<Imf_3_4::Rgba>_> levels2;
  int numYLevels;
  int numXLevels;
  int dwy;
  int dwx;
  Box2i *dw;
  TiledRgbaInputFile in;
  int levelHeight;
  int levelWidth;
  int xlevel;
  int ylevel;
  TiledRgbaOutputFile out;
  Array2D<Imf_3_4::Array2D<Imf_3_4::Rgba>_> levels;
  Header header;
  undefined4 uVar16;
  undefined4 in_stack_fffffffffffffcb4;
  int in_stack_fffffffffffffcbc;
  Array2D<Imf_3_4::Rgba> *in_stack_fffffffffffffcc0;
  Array2D<Imf_3_4::Array2D<Imf_3_4::Rgba>_> *in_stack_fffffffffffffcd0;
  long in_stack_fffffffffffffd00;
  undefined4 in_stack_fffffffffffffd08;
  undefined4 in_stack_fffffffffffffd0c;
  Array2D<Imf_3_4::Array2D<Imf_3_4::Rgba>_> *in_stack_fffffffffffffd10;
  long in_stack_fffffffffffffd30;
  long in_stack_fffffffffffffd38;
  undefined4 in_stack_fffffffffffffd40;
  undefined4 in_stack_fffffffffffffd44;
  int local_140;
  int local_13c;
  int local_138;
  int local_134;
  Vec2<float> local_130;
  undefined4 local_128;
  undefined4 local_124;
  int local_120;
  int local_11c;
  Array2D<Imf_3_4::Array2D<Imf_3_4::Rgba>_> local_118;
  int local_100;
  int local_fc;
  int local_f8;
  int local_f4;
  int *local_f0;
  Rgba local_e8 [7];
  undefined4 local_b0;
  undefined4 local_ac;
  int local_a8;
  int local_a4;
  Rgba local_a0 [3];
  Array2D<Imf_3_4::Array2D<Imf_3_4::Rgba>_> local_88;
  Vec2<float> local_60;
  Header local_58 [60];
  int local_1c;
  int local_18;
  RgbaChannels local_14;
  int local_10;
  int local_c;
  char *local_8;
  
  local_1c = in_R9D;
  local_18 = in_R8D;
  local_14 = in_ECX;
  local_10 = in_EDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  poVar7 = std::operator<<((ostream *)&std::cout,"levelMode 2");
  poVar7 = std::operator<<(poVar7,", compression ");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_18);
  poVar7 = std::operator<<(poVar7,", tileSize ");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_1c);
  poVar7 = std::operator<<(poVar7,"x");
  pvVar8 = (void *)std::ostream::operator<<(poVar7,in_stack_00000008);
  std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
  Imath_3_2::Vec2<float>::Vec2(&local_60,0.0,0.0);
  Imf_3_4::Header::Header
            (local_58,local_c,local_10,1.0,(Vec2 *)&local_60,1.0,INCREASING_Y,ZIP_COMPRESSION);
  puVar9 = (undefined4 *)Imf_3_4::Header::lineOrder();
  *puVar9 = 0;
  piVar10 = (int *)Imf_3_4::Header::compression();
  *piVar10 = local_18;
  Imf_3_4::Array2D<Imf_3_4::Array2D<Imf_3_4::Rgba>_>::Array2D(&local_88);
  poVar7 = std::operator<<((ostream *)&std::cout," writing");
  std::ostream::operator<<(poVar7,std::flush<char,std::char_traits<char>>);
  remove(local_8);
  pcVar1 = local_8;
  RVar6 = local_14;
  iVar3 = Imf_3_4::globalThreadCount();
  uVar16 = 1;
  Imf_3_4::TiledRgbaOutputFile::TiledRgbaOutputFile
            ((TiledRgbaOutputFile *)local_a0,pcVar1,local_58,RVar6,local_1c,in_stack_00000008,
             RIPMAP_LEVELS,ROUND_UP,iVar3);
  Imf_3_4::TiledRgbaOutputFile::numYLevels();
  Imf_3_4::TiledRgbaOutputFile::numXLevels();
  Imf_3_4::Array2D<Imf_3_4::Array2D<Imf_3_4::Rgba>_>::resizeErase
            ((Array2D<Imf_3_4::Array2D<Imf_3_4::Rgba>_> *)
             CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),in_stack_fffffffffffffd38
             ,in_stack_fffffffffffffd30);
  for (local_a4 = 0; iVar5 = local_a4, iVar4 = Imf_3_4::TiledRgbaOutputFile::numYLevels(),
      iVar5 < iVar4; local_a4 = local_a4 + 1) {
    for (local_a8 = 0; iVar5 = local_a8, iVar4 = Imf_3_4::TiledRgbaOutputFile::numXLevels(),
        iVar5 < iVar4; local_a8 = local_a8 + 1) {
      local_ac = Imf_3_4::TiledRgbaOutputFile::levelWidth((int)local_a0);
      local_b0 = Imf_3_4::TiledRgbaOutputFile::levelHeight((int)local_a0);
      Imf_3_4::Array2D<Imf_3_4::Array2D<Imf_3_4::Rgba>_>::operator[](&local_88,(long)local_a4);
      Imf_3_4::Array2D<Imf_3_4::Rgba>::resizeErase
                ((Array2D<Imf_3_4::Rgba> *)in_stack_fffffffffffffd10,
                 CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                 in_stack_fffffffffffffd00);
      Imf_3_4::Array2D<Imf_3_4::Array2D<Imf_3_4::Rgba>_>::operator[](&local_88,(long)local_a4);
      fillPixels(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc,iVar3);
      pAVar11 = Imf_3_4::Array2D<Imf_3_4::Array2D<Imf_3_4::Rgba>_>::operator[]
                          (&local_88,(long)local_a4);
      pRVar12 = Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](pAVar11 + local_a8,0);
      Imf_3_4::TiledRgbaOutputFile::setFrameBuffer(local_a0,(ulong)pRVar12,1);
      iVar5 = Imf_3_4::TiledRgbaOutputFile::numXTiles((int)local_a0);
      iVar4 = Imf_3_4::TiledRgbaOutputFile::numYTiles((int)local_a0);
      Imf_3_4::TiledRgbaOutputFile::writeTiles((int)local_a0,0,iVar5 + -1,0,iVar4 + -1,local_a8);
    }
  }
  Imf_3_4::TiledRgbaOutputFile::~TiledRgbaOutputFile((TiledRgbaOutputFile *)local_a0);
  poVar7 = std::operator<<((ostream *)&std::cout," reading");
  std::ostream::operator<<(poVar7,std::flush<char,std::char_traits<char>>);
  pcVar1 = local_8;
  iVar5 = Imf_3_4::globalThreadCount();
  Imf_3_4::TiledRgbaInputFile::TiledRgbaInputFile((TiledRgbaInputFile *)local_e8,pcVar1,iVar5);
  local_f0 = (int *)Imf_3_4::TiledRgbaInputFile::dataWindow();
  local_f4 = *local_f0;
  local_f8 = local_f0[1];
  local_fc = Imf_3_4::TiledRgbaInputFile::numXLevels();
  local_100 = Imf_3_4::TiledRgbaInputFile::numYLevels();
  Imf_3_4::Array2D<Imf_3_4::Array2D<Imf_3_4::Rgba>_>::Array2D
            (in_stack_fffffffffffffd10,CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08)
             ,in_stack_fffffffffffffd00);
  for (local_11c = 0; local_11c < local_100; local_11c = local_11c + 1) {
    for (local_120 = 0; local_120 < local_fc; local_120 = local_120 + 1) {
      local_124 = Imf_3_4::TiledRgbaInputFile::levelWidth((int)local_e8);
      local_128 = Imf_3_4::TiledRgbaInputFile::levelHeight((int)local_e8);
      Imf_3_4::Array2D<Imf_3_4::Array2D<Imf_3_4::Rgba>_>::operator[](&local_118,(long)local_11c);
      Imf_3_4::Array2D<Imf_3_4::Rgba>::resizeErase
                ((Array2D<Imf_3_4::Rgba> *)in_stack_fffffffffffffd10,
                 CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                 in_stack_fffffffffffffd00);
      pAVar11 = Imf_3_4::Array2D<Imf_3_4::Array2D<Imf_3_4::Rgba>_>::operator[]
                          (&local_118,(long)local_11c);
      pRVar12 = Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](pAVar11 + local_120,(long)-local_f8);
      Imf_3_4::TiledRgbaInputFile::setFrameBuffer(local_e8,(ulong)(pRVar12 + -local_f4),1);
      iVar5 = Imf_3_4::TiledRgbaInputFile::numXTiles((int)local_e8);
      iVar4 = Imf_3_4::TiledRgbaInputFile::numYTiles((int)local_e8);
      Imf_3_4::TiledRgbaInputFile::readTiles((int)local_e8,0,iVar5 + -1,0,iVar4 + -1,local_120);
    }
  }
  poVar7 = std::operator<<((ostream *)&std::cout," comparing");
  pvVar8 = (void *)std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar8,std::flush<char,std::char_traits<char>>);
  Imf_3_4::TiledRgbaInputFile::displayWindow();
  Imf_3_4::Header::displayWindow();
  bVar2 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==
                    ((Box<Imath_3_2::Vec2<int>_> *)in_stack_fffffffffffffcc0,
                     (Box<Imath_3_2::Vec2<int>_> *)CONCAT44(in_stack_fffffffffffffcbc,iVar3));
  if (!bVar2) {
    __assert_fail("in.displayWindow () == header.displayWindow ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                  ,0x182,
                  "void (anonymous namespace)::writeReadRGBARIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                 );
  }
  Imf_3_4::TiledRgbaInputFile::dataWindow();
  Imf_3_4::Header::dataWindow();
  bVar2 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==
                    ((Box<Imath_3_2::Vec2<int>_> *)in_stack_fffffffffffffcc0,
                     (Box<Imath_3_2::Vec2<int>_> *)CONCAT44(in_stack_fffffffffffffcbc,iVar3));
  if (!bVar2) {
    __assert_fail("in.dataWindow () == header.dataWindow ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                  ,0x183,
                  "void (anonymous namespace)::writeReadRGBARIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                 );
  }
  fVar14 = (float)Imf_3_4::TiledRgbaInputFile::pixelAspectRatio();
  pfVar13 = (float *)Imf_3_4::Header::pixelAspectRatio();
  if ((fVar14 != *pfVar13) || (NAN(fVar14) || NAN(*pfVar13))) {
    __assert_fail("in.pixelAspectRatio () == header.pixelAspectRatio ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                  ,0x184,
                  "void (anonymous namespace)::writeReadRGBARIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                 );
  }
  Imf_3_4::TiledRgbaInputFile::screenWindowCenter();
  v = (Vec2<float> *)Imf_3_4::Header::screenWindowCenter();
  bVar2 = Imath_3_2::Vec2<float>::operator==(&local_130,v);
  if (!bVar2) {
    __assert_fail("in.screenWindowCenter () == header.screenWindowCenter ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                  ,0x185,
                  "void (anonymous namespace)::writeReadRGBARIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                 );
  }
  fVar14 = (float)Imf_3_4::TiledRgbaInputFile::screenWindowWidth();
  pfVar13 = (float *)Imf_3_4::Header::screenWindowWidth();
  if ((fVar14 != *pfVar13) || (NAN(fVar14) || NAN(*pfVar13))) {
    __assert_fail("in.screenWindowWidth () == header.screenWindowWidth ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                  ,0x186,
                  "void (anonymous namespace)::writeReadRGBARIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                 );
  }
  iVar3 = Imf_3_4::TiledRgbaInputFile::lineOrder();
  piVar10 = (int *)Imf_3_4::Header::lineOrder();
  if (iVar3 != *piVar10) {
    __assert_fail("in.lineOrder () == header.lineOrder ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                  ,0x187,
                  "void (anonymous namespace)::writeReadRGBARIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                 );
  }
  iVar3 = Imf_3_4::TiledRgbaInputFile::compression();
  piVar10 = (int *)Imf_3_4::Header::compression();
  if (iVar3 != *piVar10) {
    __assert_fail("in.compression () == header.compression ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                  ,0x188,
                  "void (anonymous namespace)::writeReadRGBARIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                 );
  }
  RVar6 = Imf_3_4::TiledRgbaInputFile::channels();
  if (RVar6 != local_14) {
    __assert_fail("in.channels () == channels",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                  ,0x189,
                  "void (anonymous namespace)::writeReadRGBARIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                 );
  }
  local_134 = 0;
  do {
    if (local_100 <= local_134) {
      Imf_3_4::Array2D<Imf_3_4::Array2D<Imf_3_4::Rgba>_>::~Array2D(in_stack_fffffffffffffcd0);
      Imf_3_4::TiledRgbaInputFile::~TiledRgbaInputFile((TiledRgbaInputFile *)local_e8);
      remove(local_8);
      Imf_3_4::Array2D<Imf_3_4::Array2D<Imf_3_4::Rgba>_>::~Array2D(in_stack_fffffffffffffcd0);
      Imf_3_4::Header::~Header(local_58);
      return;
    }
    for (local_138 = 0; local_138 < local_fc; local_138 = local_138 + 1) {
      for (local_13c = 0; iVar3 = Imf_3_4::TiledRgbaInputFile::levelHeight((int)local_e8),
          local_13c < iVar3; local_13c = local_13c + 1) {
        local_140 = 0;
        while (iVar3 = local_140, iVar5 = Imf_3_4::TiledRgbaInputFile::levelWidth((int)local_e8),
              iVar3 < iVar5) {
          if ((local_14 & WRITE_R) == 0) {
            pAVar11 = Imf_3_4::Array2D<Imf_3_4::Array2D<Imf_3_4::Rgba>_>::operator[]
                                (&local_118,(long)local_134);
            Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](pAVar11 + local_138,(long)local_13c);
            fVar14 = Imath_3_2::half::operator_cast_to_float
                               ((half *)CONCAT44(in_stack_fffffffffffffcb4,uVar16));
            if ((fVar14 != 0.0) || (NAN(fVar14))) {
              __assert_fail("(levels2[ly][lx])[y][x].r == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                            ,0x198,
                            "void (anonymous namespace)::writeReadRGBARIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                           );
            }
          }
          else {
            pAVar11 = Imf_3_4::Array2D<Imf_3_4::Array2D<Imf_3_4::Rgba>_>::operator[]
                                (&local_118,(long)local_134);
            Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](pAVar11 + local_138,(long)local_13c);
            fVar14 = Imath_3_2::half::operator_cast_to_float
                               ((half *)CONCAT44(in_stack_fffffffffffffcb4,uVar16));
            pAVar11 = Imf_3_4::Array2D<Imf_3_4::Array2D<Imf_3_4::Rgba>_>::operator[]
                                (&local_88,(long)local_134);
            Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](pAVar11 + local_138,(long)local_13c);
            fVar15 = Imath_3_2::half::operator_cast_to_float
                               ((half *)CONCAT44(in_stack_fffffffffffffcb4,uVar16));
            if ((fVar14 != fVar15) || (NAN(fVar14) || NAN(fVar15))) {
              __assert_fail("(levels2[ly][lx])[y][x].r == (levels[ly][lx])[y][x].r",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                            ,0x196,
                            "void (anonymous namespace)::writeReadRGBARIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                           );
            }
          }
          if ((local_14 & WRITE_G) == 0) {
            pAVar11 = Imf_3_4::Array2D<Imf_3_4::Array2D<Imf_3_4::Rgba>_>::operator[]
                                (&local_118,(long)local_134);
            Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](pAVar11 + local_138,(long)local_13c);
            fVar14 = Imath_3_2::half::operator_cast_to_float
                               ((half *)CONCAT44(in_stack_fffffffffffffcb4,uVar16));
            if ((fVar14 != 0.0) || (NAN(fVar14))) {
              __assert_fail("(levels2[ly][lx])[y][x].g == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                            ,0x19f,
                            "void (anonymous namespace)::writeReadRGBARIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                           );
            }
          }
          else {
            pAVar11 = Imf_3_4::Array2D<Imf_3_4::Array2D<Imf_3_4::Rgba>_>::operator[]
                                (&local_118,(long)local_134);
            Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](pAVar11 + local_138,(long)local_13c);
            fVar14 = Imath_3_2::half::operator_cast_to_float
                               ((half *)CONCAT44(in_stack_fffffffffffffcb4,uVar16));
            pAVar11 = Imf_3_4::Array2D<Imf_3_4::Array2D<Imf_3_4::Rgba>_>::operator[]
                                (&local_88,(long)local_134);
            Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](pAVar11 + local_138,(long)local_13c);
            fVar15 = Imath_3_2::half::operator_cast_to_float
                               ((half *)CONCAT44(in_stack_fffffffffffffcb4,uVar16));
            if ((fVar14 != fVar15) || (NAN(fVar14) || NAN(fVar15))) {
              __assert_fail("(levels2[ly][lx])[y][x].g == (levels[ly][lx])[y][x].g",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                            ,0x19d,
                            "void (anonymous namespace)::writeReadRGBARIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                           );
            }
          }
          if ((local_14 & WRITE_B) == 0) {
            pAVar11 = Imf_3_4::Array2D<Imf_3_4::Array2D<Imf_3_4::Rgba>_>::operator[]
                                (&local_118,(long)local_134);
            Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](pAVar11 + local_138,(long)local_13c);
            fVar14 = Imath_3_2::half::operator_cast_to_float
                               ((half *)CONCAT44(in_stack_fffffffffffffcb4,uVar16));
            if ((fVar14 != 0.0) || (NAN(fVar14))) {
              __assert_fail("(levels2[ly][lx])[y][x].b == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                            ,0x1a6,
                            "void (anonymous namespace)::writeReadRGBARIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                           );
            }
          }
          else {
            pAVar11 = Imf_3_4::Array2D<Imf_3_4::Array2D<Imf_3_4::Rgba>_>::operator[]
                                (&local_118,(long)local_134);
            Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](pAVar11 + local_138,(long)local_13c);
            fVar14 = Imath_3_2::half::operator_cast_to_float
                               ((half *)CONCAT44(in_stack_fffffffffffffcb4,uVar16));
            pAVar11 = Imf_3_4::Array2D<Imf_3_4::Array2D<Imf_3_4::Rgba>_>::operator[]
                                (&local_88,(long)local_134);
            Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](pAVar11 + local_138,(long)local_13c);
            fVar15 = Imath_3_2::half::operator_cast_to_float
                               ((half *)CONCAT44(in_stack_fffffffffffffcb4,uVar16));
            if ((fVar14 != fVar15) || (NAN(fVar14) || NAN(fVar15))) {
              __assert_fail("(levels2[ly][lx])[y][x].b == (levels[ly][lx])[y][x].b",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                            ,0x1a4,
                            "void (anonymous namespace)::writeReadRGBARIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                           );
            }
          }
          if ((local_14 & WRITE_A) == 0) {
            pAVar11 = Imf_3_4::Array2D<Imf_3_4::Array2D<Imf_3_4::Rgba>_>::operator[]
                                (&local_118,(long)local_134);
            Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](pAVar11 + local_138,(long)local_13c);
            fVar14 = Imath_3_2::half::operator_cast_to_float
                               ((half *)CONCAT44(in_stack_fffffffffffffcb4,uVar16));
            if ((fVar14 != 1.0) || (NAN(fVar14))) {
              __assert_fail("(levels2[ly][lx])[y][x].a == 1",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                            ,0x1ad,
                            "void (anonymous namespace)::writeReadRGBARIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                           );
            }
          }
          else {
            pAVar11 = Imf_3_4::Array2D<Imf_3_4::Array2D<Imf_3_4::Rgba>_>::operator[]
                                (&local_118,(long)local_134);
            Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](pAVar11 + local_138,(long)local_13c);
            fVar14 = Imath_3_2::half::operator_cast_to_float
                               ((half *)CONCAT44(in_stack_fffffffffffffcb4,uVar16));
            in_stack_fffffffffffffcd0 =
                 (Array2D<Imf_3_4::Array2D<Imf_3_4::Rgba>_> *)
                 Imf_3_4::Array2D<Imf_3_4::Array2D<Imf_3_4::Rgba>_>::operator[]
                           (&local_88,(long)local_134);
            Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[]
                      ((Array2D<Imf_3_4::Rgba> *)(in_stack_fffffffffffffcd0 + local_138),
                       (long)local_13c);
            fVar15 = Imath_3_2::half::operator_cast_to_float
                               ((half *)CONCAT44(in_stack_fffffffffffffcb4,uVar16));
            if ((fVar14 != fVar15) || (NAN(fVar14) || NAN(fVar15))) {
              __assert_fail("(levels2[ly][lx])[y][x].a == (levels[ly][lx])[y][x].a",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                            ,0x1ab,
                            "void (anonymous namespace)::writeReadRGBARIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                           );
            }
          }
          local_140 = local_140 + 1;
        }
      }
    }
    local_134 = local_134 + 1;
  } while( true );
}

Assistant:

void
writeReadRGBARIP (
    const char   fileName[],
    int          width,
    int          height,
    RgbaChannels channels,
    Compression  comp,
    int          xSize,
    int          ySize)
{
    cout << "levelMode 2"
         << ", compression " << comp << ", tileSize " << xSize << "x" << ySize
         << endl;

    Header header (width, height);
    header.lineOrder ()   = INCREASING_Y;
    header.compression () = comp;

    Array2D<Array2D<Rgba>> levels;

    {
        cout << " writing" << flush;

        remove (fileName);
        TiledRgbaOutputFile out (
            fileName, header, channels, xSize, ySize, RIPMAP_LEVELS, ROUND_UP);

        levels.resizeErase (out.numYLevels (), out.numXLevels ());

        for (int ylevel = 0; ylevel < out.numYLevels (); ++ylevel)
        {
            for (int xlevel = 0; xlevel < out.numXLevels (); ++xlevel)
            {
                int levelWidth  = out.levelWidth (xlevel);
                int levelHeight = out.levelHeight (ylevel);
                levels[ylevel][xlevel].resizeErase (levelHeight, levelWidth);
                fillPixels (levels[ylevel][xlevel], levelWidth, levelHeight);

                out.setFrameBuffer (
                    &(levels[ylevel][xlevel])[0][0], 1, levelWidth);
                out.writeTiles (
                    0,
                    out.numXTiles (xlevel) - 1,
                    0,
                    out.numYTiles (ylevel) - 1,
                    xlevel,
                    ylevel);
            }
        }
    }

    {
        cout << " reading" << flush;

        TiledRgbaInputFile in (fileName);
        const Box2i&       dw  = in.dataWindow ();
        int                dwx = dw.min.x;
        int                dwy = dw.min.y;

        int                    numXLevels = in.numXLevels ();
        int                    numYLevels = in.numYLevels ();
        Array2D<Array2D<Rgba>> levels2 (numYLevels, numXLevels);

        for (int ylevel = 0; ylevel < numYLevels; ++ylevel)
        {
            for (int xlevel = 0; xlevel < numXLevels; ++xlevel)
            {
                int levelWidth  = in.levelWidth (xlevel);
                int levelHeight = in.levelHeight (ylevel);
                levels2[ylevel][xlevel].resizeErase (levelHeight, levelWidth);
                in.setFrameBuffer (
                    &(levels2[ylevel][xlevel])[-dwy][-dwx], 1, levelWidth);

                in.readTiles (
                    0,
                    in.numXTiles (xlevel) - 1,
                    0,
                    in.numYTiles (ylevel) - 1,
                    xlevel,
                    ylevel);
            }
        }

        cout << " comparing" << endl << flush;

        assert (in.displayWindow () == header.displayWindow ());
        assert (in.dataWindow () == header.dataWindow ());
        assert (in.pixelAspectRatio () == header.pixelAspectRatio ());
        assert (in.screenWindowCenter () == header.screenWindowCenter ());
        assert (in.screenWindowWidth () == header.screenWindowWidth ());
        assert (in.lineOrder () == header.lineOrder ());
        assert (in.compression () == header.compression ());
        assert (in.channels () == channels);

        for (int ly = 0; ly < numYLevels; ++ly)
        {
            for (int lx = 0; lx < numXLevels; ++lx)
            {
                for (int y = 0; y < in.levelHeight (ly); ++y)
                {
                    for (int x = 0; x < in.levelWidth (lx); ++x)
                    {
                        if (channels & WRITE_R)
                            assert (
                                (levels2[ly][lx])[y][x].r ==
                                (levels[ly][lx])[y][x].r);
                        else
                            assert ((levels2[ly][lx])[y][x].r == 0);

                        if (channels & WRITE_G)
                            assert (
                                (levels2[ly][lx])[y][x].g ==
                                (levels[ly][lx])[y][x].g);
                        else
                            assert ((levels2[ly][lx])[y][x].g == 0);

                        if (channels & WRITE_B)
                            assert (
                                (levels2[ly][lx])[y][x].b ==
                                (levels[ly][lx])[y][x].b);
                        else
                            assert ((levels2[ly][lx])[y][x].b == 0);

                        if (channels & WRITE_A)
                            assert (
                                (levels2[ly][lx])[y][x].a ==
                                (levels[ly][lx])[y][x].a);
                        else
                            assert ((levels2[ly][lx])[y][x].a == 1);
                    }
                }
            }
        }
    }

    remove (fileName);
}